

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrDestroySenseDataProviderBD(XrSenseDataProviderBD provider)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_270 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_250;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  XrSenseDataProviderBD_T local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_3c;
  undefined1 local_38 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrSenseDataProviderBD pXStack_18;
  XrResult xr_result;
  XrSenseDataProviderBD provider_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_18 = provider;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_38);
  local_3c = XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSenseDataProviderBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_38
             ,&stack0xffffffffffffffe8,&local_3c);
  VVar1 = VerifyXrSenseDataProviderBDHandle(&stack0xffffffffffffffe8);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    HandleInfo<XrSenseDataProviderBD_T_*>::getWithInstanceInfo
              (&g_sensedataproviderbd_info,pXStack_18);
    provider_local._4_4_ =
         objects_info.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    std::operator<<((ostream *)local_1c8,"Invalid XrSenseDataProviderBD handle \"provider\" ");
    HandleToHexString<XrSenseDataProviderBD_T*>(local_1e8);
    std::operator<<((ostream *)local_1c8,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_208,"VUID-xrDestroySenseDataProviderBD-provider-parameter",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"xrDestroySenseDataProviderBD",&local_231);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_250,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_38);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_208,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_230,&local_250,local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_250);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    provider_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_38);
  return provider_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrDestroySenseDataProviderBD(
XrSenseDataProviderBD provider) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(provider, XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSenseDataProviderBDHandle(&provider);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSenseDataProviderBD handle \"provider\" ";
                oss << HandleToHexString(provider);
                CoreValidLogMessage(nullptr, "VUID-xrDestroySenseDataProviderBD-provider-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrDestroySenseDataProviderBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sensedataproviderbd_info.getWithInstanceInfo(provider);
        GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info = info_with_instance.first;
        (void)gen_sensedataproviderbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}